

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

void RandAddEvent(uint32_t event_info)

{
  undefined8 uVar1;
  RNGState *pRVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  undefined4 local_30;
  uint32_t local_2c;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar2 = anon_unknown.dwarf_5b37d62::GetRNGState();
  local_28._M_device = &(pRVar2->m_events_mutex).super_mutex;
  local_28._M_owns = false;
  local_2c = event_info;
  std::unique_lock<std::mutex>::lock(&local_28);
  CSHA256::Write(&pRVar2->m_events_hasher,(uchar *)&local_2c,4);
  uVar1 = rdtsc();
  local_30 = (undefined4)uVar1;
  CSHA256::Write(&pRVar2->m_events_hasher,(uchar *)&local_30,4);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RandAddEvent(const uint32_t event_info) noexcept { GetRNGState().AddEvent(event_info); }